

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O1

void do_cmd(char *host,char *user,char *cmd)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  Conf *pCVar5;
  BackendVtable *pBVar6;
  char *pcVar7;
  char *__s;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  LogContext *pLVar11;
  char *realhost;
  
  if ((host != (char *)0x0) && (*host != '\0')) {
    sVar4 = host_strcspn(host,":");
    host[sVar4] = '\0';
    _Var2 = cmdline_loaded_session();
    if (_Var2) {
      conf_set_str(conf,0,host);
    }
    else {
      pCVar5 = conf_new();
      conf_set_str(pCVar5,0,anon_var_dwarf_34748 + 10);
      do_defaults(host,pCVar5);
      pcVar7 = conf_get_str(pCVar5,0);
      if (*pcVar7 == '\0') {
        conf_set_str(conf,0,host);
      }
      else {
        do_defaults(host,conf);
      }
      conf_free(pCVar5);
    }
    iVar3 = conf_get_int(conf,2);
    pBVar6 = backend_vt_from_proto(iVar3);
    if (pBVar6 == (BackendVtable *)0x0) {
      conf_set_int(conf,2,3);
      conf_set_int(conf,1,0x16);
    }
    cmdline_run_saved(conf);
    pcVar7 = conf_get_str(conf,0);
    __s = dupstr(pcVar7);
    sVar8 = strspn(__s," \t");
    pcVar7 = __s + sVar8;
    pcVar10 = __s;
    if ((__s[sVar8] != '\0') && (pcVar9 = strrchr(pcVar7,0x40), pcVar9 != (char *)0x0)) {
      *pcVar9 = '\0';
      conf_set_str(conf,0x39,pcVar7);
      pcVar7 = pcVar9 + 1;
    }
    do {
      cVar1 = *pcVar7;
      if ((cVar1 != '\t') && (cVar1 != ' ')) {
        if (cVar1 == '\0') goto LAB_00111d60;
        *pcVar10 = cVar1;
        pcVar10 = pcVar10 + 1;
      }
      pcVar7 = pcVar7 + 1;
    } while( true );
  }
  pcVar7 = "Empty host name";
LAB_0011211b:
  bump(pcVar7);
LAB_00111d60:
  *pcVar10 = '\0';
  conf_set_str(conf,0,__s);
  safefree(__s);
  if ((user == (char *)0x0) || (*user == '\0')) {
    pcVar7 = conf_get_str(conf,0x39);
    if (*pcVar7 == '\0') {
      pcVar7 = get_username();
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "Empty user name";
        goto LAB_0011211b;
      }
      if (verbose == '\x01') {
        tell_user(_stderr,"Guessing user name: %s",pcVar7);
      }
      conf_set_str(conf,0x39,pcVar7);
      safefree(pcVar7);
    }
  }
  else {
    conf_set_str(conf,0x39,user);
  }
  iVar3 = conf_get_int(conf,2);
  pBVar6 = backend_vt_from_proto(iVar3);
  if (pBVar6 == (BackendVtable *)0x0) {
    conf_set_int(conf,2,3);
    conf_set_int(conf,1,0x16);
  }
  conf_set_bool(conf,0xaa,false);
  conf_set_bool(conf,0x1e,false);
  conf_set_bool(conf,0xbf,true);
  while (pcVar7 = conf_get_str_nthstrkey(conf,0xb0,0), pcVar7 != (char *)0x0) {
    conf_del_str_str(conf,0xb0,pcVar7);
  }
  conf_set_str(conf,0x15,anon_var_dwarf_34748 + 10);
  if (try_sftp == '\0') {
    main_cmd_is_sftp = 1;
    conf_set_str(conf,0x14,"sftp");
    conf_set_bool(conf,0x30,true);
    fallback_cmd_is_sftp = try_scp != '\0';
    if ((bool)fallback_cmd_is_sftp) {
      cmd = 
      "test -x /usr/lib/sftp-server && exec /usr/lib/sftp-server\ntest -x /usr/local/lib/sftp-server && exec /usr/local/lib/sftp-server\nexec sftp-server"
      ;
    }
    conf_set_str(conf,0x15,cmd);
    iVar3 = 0x31;
  }
  else {
    main_cmd_is_sftp = 0;
    conf_set_str(conf,0x14,cmd);
    iVar3 = 0x30;
  }
  conf_set_bool(conf,iVar3,false);
  conf_set_bool(conf,0x16,true);
  pLVar11 = log_init(console_cli_logpolicy,conf);
  platform_psftp_pre_conn_setup(console_cli_logpolicy);
  iVar3 = conf_get_int(conf,2);
  pBVar6 = backend_vt_from_proto(iVar3);
  pCVar5 = conf;
  pcVar7 = conf_get_str(conf,0);
  iVar3 = conf_get_int(conf,1);
  _Var2 = conf_get_bool(conf,8);
  pcVar7 = (*pBVar6->init)(pBVar6,pscp_seat,&backend,pLVar11,pCVar5,pcVar7,iVar3,&realhost,false,
                           _Var2);
  if (pcVar7 != (char *)0x0) {
    bump("ssh_init: %s",pcVar7);
  }
  do {
    _Var2 = (*backend->vt->sendok)(backend);
    if (_Var2) {
      _Var2 = ssh_fallback_cmd(backend);
      pcVar7 = &main_cmd_is_sftp;
      if (_Var2) {
        pcVar7 = &fallback_cmd_is_sftp;
      }
      using_sftp = (_Bool)*pcVar7;
      if (verbose == '\x01') {
        if (using_sftp == false) {
          pcVar7 = "Using SCP1";
        }
        else {
          pcVar7 = "Using SFTP";
        }
        tell_user(_stderr,pcVar7);
      }
      goto LAB_001120c8;
    }
    iVar3 = (*backend->vt->exitcode)(backend);
  } while ((iVar3 < 0) && (iVar3 = ssh_sftp_loop_iteration(), -1 < iVar3));
  errs = errs + L'\x01';
LAB_001120c8:
  if (((verbose == '\x01') && (realhost != (char *)0x0)) && (errs == L'\0')) {
    tell_user(_stderr,"Connected to %s");
  }
  safefree(realhost);
  return;
}

Assistant:

static void do_cmd(char *host, char *user, char *cmd)
{
    const char *err;
    char *realhost;
    LogContext *logctx;

    if (host == NULL || host[0] == '\0')
        bump("Empty host name");

    /*
     * Remove a colon suffix.
     */
    host[host_strcspn(host, ":")] = '\0';

    /*
     * If we haven't loaded session details already (e.g., from -load),
     * try looking for a session called "host".
     */
    if (!cmdline_loaded_session()) {
        /* Try to load settings for `host' into a temporary config */
        Conf *conf2 = conf_new();
        conf_set_str(conf2, CONF_host, "");
        do_defaults(host, conf2);
        if (conf_get_str(conf2, CONF_host)[0] != '\0') {
            /* Settings present and include hostname */
            /* Re-load data into the real config. */
            do_defaults(host, conf);
        } else {
            /* Session doesn't exist or mention a hostname. */
            /* Use `host' as a bare hostname. */
            conf_set_str(conf, CONF_host, host);
        }
        conf_free(conf2);
    } else {
        /* Patch in hostname `host' to session details. */
        conf_set_str(conf, CONF_host, host);
    }

    /*
     * Force protocol to SSH if the user has somehow contrived to
     * select one we don't support (e.g. by loading an inappropriate
     * saved session). In that situation we assume the port number is
     * useless too.)
     */
    if (!backend_vt_from_proto(conf_get_int(conf, CONF_protocol))) {
        conf_set_int(conf, CONF_protocol, PROT_SSH);
        conf_set_int(conf, CONF_port, 22);
    }

    /*
     * Enact command-line overrides.
     */
    cmdline_run_saved(conf);

    /*
     * Muck about with the hostname in various ways.
     */
    {
        char *hostbuf = dupstr(conf_get_str(conf, CONF_host));
        char *host = hostbuf;
        char *p, *q;

        /*
         * Trim leading whitespace.
         */
        host += strspn(host, " \t");

        /*
         * See if host is of the form user@host, and separate out
         * the username if so.
         */
        if (host[0] != '\0') {
            char *atsign = strrchr(host, '@');
            if (atsign) {
                *atsign = '\0';
                conf_set_str(conf, CONF_username, host);
                host = atsign + 1;
            }
        }

        /*
         * Remove any remaining whitespace.
         */
        p = hostbuf;
        q = host;
        while (*q) {
            if (*q != ' ' && *q != '\t')
                *p++ = *q;
            q++;
        }
        *p = '\0';

        conf_set_str(conf, CONF_host, hostbuf);
        sfree(hostbuf);
    }

    /* Set username */
    if (user != NULL && user[0] != '\0') {
        conf_set_str(conf, CONF_username, user);
    } else if (conf_get_str(conf, CONF_username)[0] == '\0') {
        user = get_username();
        if (!user)
            bump("Empty user name");
        else {
            if (verbose)
                tell_user(stderr, "Guessing user name: %s", user);
            conf_set_str(conf, CONF_username, user);
            sfree(user);
        }
    }

    /*
     * Force protocol to SSH if the user has somehow contrived to
     * select one we don't support (e.g. by loading an inappropriate
     * saved session). In that situation we assume the port number is
     * useless too.)
     */
    if (!backend_vt_from_proto(conf_get_int(conf, CONF_protocol))) {
        conf_set_int(conf, CONF_protocol, PROT_SSH);
        conf_set_int(conf, CONF_port, 22);
    }

    /*
     * Disable scary things which shouldn't be enabled for simple
     * things like SCP and SFTP: agent forwarding, port forwarding,
     * X forwarding.
     */
    conf_set_bool(conf, CONF_x11_forward, false);
    conf_set_bool(conf, CONF_agentfwd, false);
    conf_set_bool(conf, CONF_ssh_simple, true);
    {
        char *key;
        while ((key = conf_get_str_nthstrkey(conf, CONF_portfwd, 0)) != NULL)
            conf_del_str_str(conf, CONF_portfwd, key);
    }

    /*
     * Set up main and possibly fallback command depending on
     * options specified by user.
     * Attempt to start the SFTP subsystem as a first choice,
     * falling back to the provided scp command if that fails.
     */
    conf_set_str(conf, CONF_remote_cmd2, "");
    if (try_sftp) {
        /* First choice is SFTP subsystem. */
        main_cmd_is_sftp = true;
        conf_set_str(conf, CONF_remote_cmd, "sftp");
        conf_set_bool(conf, CONF_ssh_subsys, true);
        if (try_scp) {
            /* Fallback is to use the provided scp command. */
            fallback_cmd_is_sftp = false;
            conf_set_str(conf, CONF_remote_cmd2, cmd);
            conf_set_bool(conf, CONF_ssh_subsys2, false);
        } else {
            /* Since we're not going to try SCP, we may as well try
             * harder to find an SFTP server, since in the current
             * implementation we have a spare slot. */
            fallback_cmd_is_sftp = true;
            /* see psftp.c for full explanation of this kludge */
            conf_set_str(conf, CONF_remote_cmd2,
                         "test -x /usr/lib/sftp-server &&"
                         " exec /usr/lib/sftp-server\n"
                         "test -x /usr/local/lib/sftp-server &&"
                         " exec /usr/local/lib/sftp-server\n"
                         "exec sftp-server");
            conf_set_bool(conf, CONF_ssh_subsys2, false);
        }
    } else {
        /* Don't try SFTP at all; just try the scp command. */
        main_cmd_is_sftp = false;
        conf_set_str(conf, CONF_remote_cmd, cmd);
        conf_set_bool(conf, CONF_ssh_subsys, false);
    }
    conf_set_bool(conf, CONF_nopty, true);

    logctx = log_init(console_cli_logpolicy, conf);

    platform_psftp_pre_conn_setup(console_cli_logpolicy);

    err = backend_init(backend_vt_from_proto(
                           conf_get_int(conf, CONF_protocol)),
                       pscp_seat, &backend, logctx, conf,
                       conf_get_str(conf, CONF_host),
                       conf_get_int(conf, CONF_port),
                       &realhost, 0,
                       conf_get_bool(conf, CONF_tcp_keepalives));
    if (err != NULL)
        bump("ssh_init: %s", err);
    ssh_scp_init();
    if (verbose && realhost != NULL && errs == 0)
        tell_user(stderr, "Connected to %s", realhost);
    sfree(realhost);
}